

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O1

void __thiscall amrex::Amr::setRecordRunInfoTerse(Amr *this,string *filename)

{
  string local_30;
  
  this->record_run_info_terse = 1;
  if (*(int *)(ParallelContext::frames + 0xc) == 0) {
    std::ofstream::open((char *)&this->runlog_terse,(_Ios_Openmode)(filename->_M_dataplus)._M_p);
    if (*(int *)(&this->field_0x6f0 + *(long *)(*(long *)&this->runlog_terse + -0x18)) != 0) {
      FileOpenFailed(filename);
    }
  }
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"Amr::setRecordRunInfoTerse","");
  ParallelDescriptor::Barrier(&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
Amr::setRecordRunInfoTerse (const std::string& filename)
{
    record_run_info_terse = true;
    if (ParallelDescriptor::IOProcessor())
    {
        runlog_terse.open(filename.c_str(),std::ios::out|std::ios::app);
        if (!runlog_terse.good()) {
            amrex::FileOpenFailed(filename);
        }
    }
    ParallelDescriptor::Barrier("Amr::setRecordRunInfoTerse");
}